

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

Float pbrt::SphericalTriangleArea(Vector3f a,Vector3f b,Vector3f c)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar11 [16];
  undefined1 auVar18 [64];
  undefined1 auVar12 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  float fVar39;
  undefined4 local_6c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar37._4_60_ = c._12_60_;
  auVar37._0_4_ = c.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar35._8_56_ = c._8_56_;
  auVar35._0_8_ = c.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar34._4_60_ = b._12_60_;
  auVar34._0_4_ = b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._8_56_ = b._8_56_;
  auVar30._0_8_ = b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._4_60_ = a._12_60_;
  auVar28._0_4_ = a.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._8_56_ = a._8_56_;
  auVar17._0_8_ = a.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29 = auVar30._0_16_;
  auVar11 = auVar17._0_16_;
  auVar21 = auVar28._0_16_;
  auVar27 = ZEXT416((uint)(a.super_Tuple3<pbrt::Vector3,_float>.x * auVar34._0_4_));
  auVar9 = vfmsub213ss_fma(auVar29,auVar21,auVar27);
  auVar32 = auVar34._0_16_;
  auVar27 = vfnmadd231ss_fma(auVar27,auVar11,auVar32);
  fVar39 = auVar9._0_4_ + auVar27._0_4_;
  auVar6 = vpermt2ps_avx512vl(auVar11,_DAT_00447c50,auVar21);
  auVar7 = vpermt2ps_avx512vl(auVar29,_DAT_00447c50,auVar32);
  auVar27._0_4_ = auVar6._0_4_ * b.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar27._4_4_ = auVar6._4_4_ * b.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar27._8_4_ = auVar6._8_4_ * b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._12_4_ = auVar6._12_4_ * b._12_4_;
  auVar9 = vfmsub213ps_fma(auVar7,auVar11,auVar27);
  auVar27 = vfnmadd231ps_fma(auVar27,auVar6,auVar29);
  auVar38._0_4_ = auVar9._0_4_ + auVar27._0_4_;
  auVar38._4_4_ = auVar9._4_4_ + auVar27._4_4_;
  auVar38._8_4_ = auVar9._8_4_ + auVar27._8_4_;
  auVar38._12_4_ = auVar9._12_4_ + auVar27._12_4_;
  auVar8._0_4_ = auVar38._0_4_ * auVar38._0_4_;
  auVar8._4_4_ = auVar38._4_4_ * auVar38._4_4_;
  auVar8._8_4_ = auVar38._8_4_ * auVar38._8_4_;
  auVar8._12_4_ = auVar38._12_4_ * auVar38._12_4_;
  auVar9 = vmovshdup_avx(auVar8);
  fVar10 = auVar8._0_4_ + auVar9._0_4_ + fVar39 * fVar39;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    auVar22 = auVar35._0_16_;
    auVar23 = auVar37._0_16_;
    auVar8 = vpermi2ps_avx512vl(_DAT_00447c50,auVar22,auVar23);
    auVar27 = ZEXT416((uint)(b.super_Tuple3<pbrt::Vector3,_float>.x * auVar37._0_4_));
    auVar9 = vfmsub213ss_fma(auVar32,auVar22,auVar27);
    auVar27 = vfnmadd231ss_fma(auVar27,auVar29,auVar23);
    fVar31 = auVar27._0_4_ + auVar9._0_4_;
    auVar32._0_4_ = auVar7._0_4_ * c.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar32._4_4_ = auVar7._4_4_ * c.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar32._8_4_ = auVar7._8_4_ * c.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._12_4_ = auVar7._12_4_ * c._12_4_;
    auVar9 = vfmsub213ps_fma(auVar29,auVar8,auVar32);
    auVar27 = vfnmadd213ps_fma(auVar7,auVar22,auVar32);
    auVar7._0_4_ = auVar27._0_4_ + auVar9._0_4_;
    auVar7._4_4_ = auVar27._4_4_ + auVar9._4_4_;
    auVar7._8_4_ = auVar27._8_4_ + auVar9._8_4_;
    auVar7._12_4_ = auVar27._12_4_ + auVar9._12_4_;
    auVar29._0_4_ = auVar7._0_4_ * auVar7._0_4_;
    auVar29._4_4_ = auVar7._4_4_ * auVar7._4_4_;
    auVar29._8_4_ = auVar7._8_4_ * auVar7._8_4_;
    auVar29._12_4_ = auVar7._12_4_ * auVar7._12_4_;
    auVar9 = vmovshdup_avx(auVar29);
    fVar1 = auVar29._0_4_ + auVar9._0_4_ + fVar31 * fVar31;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar27 = ZEXT416((uint)(c.super_Tuple3<pbrt::Vector3,_float>.x * auVar28._0_4_));
      auVar9 = vfmsub213ss_fma(auVar23,auVar11,auVar27);
      auVar27 = vfnmadd213ss_fma(auVar21,auVar22,auVar27);
      fVar36 = auVar9._0_4_ + auVar27._0_4_;
      auVar21._0_4_ = auVar8._0_4_ * a.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar21._4_4_ = auVar8._4_4_ * a.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21._8_4_ = auVar8._8_4_ * a.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._12_4_ = auVar8._12_4_ * a._12_4_;
      auVar9 = vfmsub213ps_fma(auVar6,auVar22,auVar21);
      auVar27 = vfnmadd213ps_fma(auVar11,auVar8,auVar21);
      auVar6._0_4_ = auVar9._0_4_ + auVar27._0_4_;
      auVar6._4_4_ = auVar9._4_4_ + auVar27._4_4_;
      auVar6._8_4_ = auVar9._8_4_ + auVar27._8_4_;
      auVar6._12_4_ = auVar9._12_4_ + auVar27._12_4_;
      auVar11._0_4_ = auVar6._0_4_ * auVar6._0_4_;
      auVar11._4_4_ = auVar6._4_4_ * auVar6._4_4_;
      auVar11._8_4_ = auVar6._8_4_ * auVar6._8_4_;
      auVar11._12_4_ = auVar6._12_4_ * auVar6._12_4_;
      auVar9 = vmovshdup_avx(auVar11);
      fVar2 = auVar11._0_4_ + auVar9._0_4_ + fVar36 * fVar36;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        auVar9 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
        fVar10 = auVar9._0_4_;
        fVar39 = fVar39 / fVar10;
        auVar9._4_4_ = fVar10;
        auVar9._0_4_ = fVar10;
        auVar9._8_4_ = fVar10;
        auVar9._12_4_ = fVar10;
        auVar9 = vdivps_avx(auVar38,auVar9);
        auVar27 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
        auVar11 = vmovshdup_avx(auVar9);
        fVar10 = auVar27._0_4_;
        fVar31 = fVar31 / fVar10;
        auVar33._4_4_ = fVar10;
        auVar33._0_4_ = fVar10;
        auVar33._8_4_ = fVar10;
        auVar33._12_4_ = fVar10;
        auVar27 = vdivps_avx(auVar7,auVar33);
        auVar7 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
        fVar10 = auVar7._0_4_;
        fVar36 = fVar36 / fVar10;
        auVar22._4_4_ = fVar10;
        auVar22._0_4_ = fVar10;
        auVar22._8_4_ = fVar10;
        auVar22._12_4_ = fVar10;
        auVar6 = vdivps_avx(auVar6,auVar22);
        auVar23._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
        auVar23._8_4_ = auVar6._8_4_ ^ 0x80000000;
        auVar23._12_4_ = auVar6._12_4_ ^ 0x80000000;
        auVar7 = vshufps_avx(auVar23,auVar23,0xf5);
        auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar39 * fVar36)),auVar11,auVar7);
        auVar7 = vfnmadd231ss_fma(auVar7,auVar9,auVar6);
        if (0.0 <= auVar7._0_4_) {
          auVar7 = vsubps_avx(auVar23,auVar9);
          auVar25._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar25._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar25._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar25._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar25);
          auVar7 = ZEXT416((uint)(auVar25._0_4_ +
                                 auVar7._0_4_ + (-fVar36 - fVar39) * (-fVar36 - fVar39)));
          auVar7 = vsqrtss_avx(auVar7,auVar7);
          auVar11 = ZEXT416((uint)(auVar7._0_4_ * 0.5));
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
          uVar3 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          local_6c = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar7._0_4_));
          local_6c = local_6c + local_6c;
        }
        else {
          auVar7 = vsubps_avx(auVar9,auVar6);
          auVar24._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar24._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar24._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar24._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar24);
          auVar7 = ZEXT416((uint)(auVar24._0_4_ +
                                 auVar7._0_4_ + (fVar39 - fVar36) * (fVar39 - fVar36)));
          auVar7 = vsqrtss_avx(auVar7,auVar7);
          auVar11 = ZEXT416((uint)(auVar7._0_4_ * 0.5));
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
          uVar3 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar18._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar7._0_4_));
          auVar18._4_60_ = extraout_var;
          auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar18._0_16_,ZEXT416(0x40490fdb)
                                  );
          local_6c = auVar7._0_4_;
        }
        auVar12._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
        auVar12._8_4_ = auVar9._8_4_ ^ 0x80000000;
        auVar12._12_4_ = auVar9._12_4_ ^ 0x80000000;
        auVar7 = vmovshdup_avx(auVar27);
        auVar11 = vshufps_avx(auVar12,auVar12,0xf5);
        auVar7 = vfmsub213ss_fma(auVar7,auVar11,ZEXT416((uint)(fVar31 * fVar39)));
        auVar7 = vfnmadd231ss_fma(auVar7,auVar27,auVar9);
        if (0.0 <= auVar7._0_4_) {
          auVar9 = vsubps_avx(auVar12,auVar27);
          auVar13._0_4_ = auVar9._0_4_ * auVar9._0_4_;
          auVar13._4_4_ = auVar9._4_4_ * auVar9._4_4_;
          auVar13._8_4_ = auVar9._8_4_ * auVar9._8_4_;
          auVar13._12_4_ = auVar9._12_4_ * auVar9._12_4_;
          auVar9 = vmovshdup_avx(auVar13);
          auVar9 = ZEXT416((uint)(auVar13._0_4_ +
                                 auVar9._0_4_ + (-fVar39 - fVar31) * (-fVar39 - fVar31)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar7 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
          uVar3 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar39 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          fVar39 = fVar39 + fVar39;
        }
        else {
          auVar9 = vsubps_avx(auVar27,auVar9);
          auVar26._0_4_ = auVar9._0_4_ * auVar9._0_4_;
          auVar26._4_4_ = auVar9._4_4_ * auVar9._4_4_;
          auVar26._8_4_ = auVar9._8_4_ * auVar9._8_4_;
          auVar26._12_4_ = auVar9._12_4_ * auVar9._12_4_;
          auVar9 = vmovshdup_avx(auVar26);
          auVar9 = ZEXT416((uint)(auVar26._0_4_ +
                                 auVar9._0_4_ + (fVar31 - fVar39) * (fVar31 - fVar39)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar7 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
          uVar3 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar19._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          auVar19._4_60_ = extraout_var_00;
          auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar19._0_16_,ZEXT416(0x40490fdb)
                                  );
          fVar39 = auVar9._0_4_;
        }
        auVar14._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
        auVar14._8_4_ = auVar27._8_4_ ^ 0x80000000;
        auVar14._12_4_ = auVar27._12_4_ ^ 0x80000000;
        auVar9 = vmovshdup_avx(auVar6);
        auVar7 = vshufps_avx(auVar14,auVar14,0xf5);
        auVar9 = vfmsub213ss_fma(auVar9,auVar7,ZEXT416((uint)(fVar36 * fVar31)));
        auVar9 = vfnmadd231ss_fma(auVar9,auVar6,auVar27);
        if (0.0 <= auVar9._0_4_) {
          auVar9 = vsubps_avx(auVar14,auVar6);
          auVar16._0_4_ = auVar9._0_4_ * auVar9._0_4_;
          auVar16._4_4_ = auVar9._4_4_ * auVar9._4_4_;
          auVar16._8_4_ = auVar9._8_4_ * auVar9._8_4_;
          auVar16._12_4_ = auVar9._12_4_ * auVar9._12_4_;
          auVar9 = vmovshdup_avx(auVar16);
          auVar9 = ZEXT416((uint)(auVar16._0_4_ +
                                 auVar9._0_4_ + (-fVar31 - fVar36) * (-fVar31 - fVar36)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar27 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27);
          uVar3 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar10 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          fVar10 = fVar10 + fVar10;
        }
        else {
          auVar9 = vsubps_avx(auVar6,auVar27);
          auVar15._0_4_ = auVar9._0_4_ * auVar9._0_4_;
          auVar15._4_4_ = auVar9._4_4_ * auVar9._4_4_;
          auVar15._8_4_ = auVar9._8_4_ * auVar9._8_4_;
          auVar15._12_4_ = auVar9._12_4_ * auVar9._12_4_;
          auVar9 = vmovshdup_avx(auVar15);
          auVar9 = ZEXT416((uint)(auVar15._0_4_ +
                                 auVar9._0_4_ + (fVar36 - fVar31) * (fVar36 - fVar31)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar27 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27);
          uVar3 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar20._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          auVar20._4_60_ = extraout_var_01;
          auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar20._0_16_,ZEXT416(0x40490fdb)
                                  );
          fVar10 = auVar9._0_4_;
        }
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar9 = vandps_avx512vl(ZEXT416((uint)(fVar39 + local_6c + fVar10 + -3.1415927)),auVar5);
        return auVar9._0_4_;
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU inline auto DifferenceOfProducts(Ta a, Tb b, Tc c, Td d) {
    auto cd = c * d;
    auto differenceOfProducts = FMA(a, b, -cd);
    auto error = FMA(-c, d, cd);
    return differenceOfProducts + error;
}